

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int openDirectory(char *zFilename,int *pFd)

{
  int errcode;
  size_t sVar1;
  bool bVar2;
  int local_230;
  char local_228 [8];
  char zDirname [513];
  int local_1c;
  int fd;
  int ii;
  int *pFd_local;
  char *zFilename_local;
  
  stack0xffffffffffffffe0 = -1;
  sqlite3_snprintf(0x200,local_228,"%s",zFilename);
  sVar1 = strlen(local_228);
  local_1c = (int)sVar1;
  while( true ) {
    bVar2 = false;
    if (1 < local_1c) {
      bVar2 = local_228[local_1c] != '/';
    }
    if (!bVar2) break;
    local_1c = local_1c + -1;
  }
  if (0 < local_1c) {
    local_228[local_1c] = '\0';
    register0x00000000 = robust_open(local_228,0,0);
  }
  *pFd = stack0xffffffffffffffe0;
  if (stack0xffffffffffffffe0 < 0) {
    errcode = sqlite3CantopenError(0x67e1);
    local_230 = unixLogErrorAtLine(errcode,"open",local_228,0x67e1);
  }
  else {
    local_230 = 0;
  }
  return local_230;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
      OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
    }
  }
  *pFd = fd;
  return (fd>=0?SQLITE_OK:unixLogError(SQLITE_CANTOPEN_BKPT, "open", zDirname));
}